

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O3

void __thiscall spdlog::details::z_formatter::format(z_formatter *this,log_msg *msg,tm *tm_time)

{
  long lVar1;
  Buffer<char> *pBVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  size_t sVar6;
  
  lVar1 = tm_time->tm_gmtoff;
  pBVar2 = (msg->formatted).super_BasicWriter<char>.buffer_;
  sVar6 = pBVar2->size_;
  if (sVar6 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar6 + 1);
    sVar6 = pBVar2->size_;
  }
  auVar4 = SEXT816(lVar1) * ZEXT816(0x8888888888888889);
  uVar5 = (int)(auVar4._8_8_ >> 5) - (auVar4._12_4_ >> 0x1f);
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  pBVar2->size_ = sVar6 + 1;
  pBVar2->ptr_[sVar6] = (char)((int)uVar5 >> 0x1f) * -2 + '+';
  pad_n_join(&msg->formatted,uVar3 / 0x3c,uVar3 % 0x3c,(char)((ulong)uVar3 / 0x3c));
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
#ifdef _WIN32
        int total_minutes = get_cached_offset(msg, tm_time);
#else
        // No need to chache under gcc,
        // it is very fast (already stored in tm.tm_gmtoff)
        int total_minutes = os::utc_minutes_offset(tm_time);
#endif
        bool is_negative = total_minutes < 0;
        char sign;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            sign = '-';
        }
        else
        {
            sign = '+';
        }

        int h = total_minutes / 60;
        int m = total_minutes % 60;
        msg.formatted << sign;
        pad_n_join(msg.formatted, h, m, ':');
    }